

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O1

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddRight
          (CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  int *piVar1;
  int iVar2;
  TVariableType type_00;
  bool bVar3;
  TVariableType TVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  TVar4 = checkTypeTag(this,type,(CQualifier **)0x0);
  if (TVar4 != VT_None) {
    bVar3 = checkName(this,name);
    if (bVar3) {
      iVar2 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4);
      lVar8 = (long)iVar2;
      if (lVar8 == -1) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct((ulong)local_48,'\x01');
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x13b432);
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_78 = *plVar6;
          lStack_70 = plVar5[3];
          local_88 = &local_78;
        }
        else {
          local_78 = *plVar6;
          local_88 = (long *)*plVar5;
        }
        local_80 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_68.field_2._M_allocated_capacity = *psVar7;
          local_68.field_2._8_8_ = plVar5[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar7;
          local_68._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_68._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        CErrorsHelper::RaiseError(&this->super_CErrorsHelper,ES_Error,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88);
        }
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
      }
      else {
        type_00 = this->variables[lVar8].Type;
        if (type_00 == TVar4) {
          piVar1 = &this->variables[lVar8].CountRight;
          *piVar1 = *piVar1 + 1;
          return iVar2;
        }
        errorTypesNotMatched(this,name,type_00);
      }
    }
  }
  return -1;
}

Assistant:

TVariableIndex CVariablesBuilder::AddRight( const TVariableName name,
	const TVariableTypeTag type )
{
	const TVariableType variableType = checkTypeTag( type );
	if( variableType != VT_None && checkName( name ) ) {
		const TVariableIndex variableIndex = variableNameToIndex[name];
		if( variableIndex != InvalidVariableIndex ) {
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		} else {
			error( "variable `" + std::string( 1, static_cast<char>( name ) )
				+ "` wasn't defined in left part of rule" );
		}
	}
	return InvalidVariableIndex;
}